

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O0

void s2builderutil::DiscardEdges
               (Graph *g,vector<int,_std::allocator<int>_> *edges_to_discard,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *new_edges,
               vector<int,_std::allocator<int>_> *new_input_edge_id_set_ids)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  bool bVar3;
  bool bVar4;
  EdgeId EVar5;
  reference piVar6;
  Edge *__x;
  ostream *poVar7;
  S2LogMessage local_a8;
  S2LogMessageVoidify local_91;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  InputEdgeIdSetId local_84;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int local_74;
  const_iterator cStack_70;
  int e;
  const_iterator it;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  int *local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *new_input_edge_id_set_ids_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *new_edges_local;
  vector<int,_std::allocator<int>_> *edges_to_discard_local;
  Graph *g_local;
  
  local_28 = new_input_edge_id_set_ids;
  new_input_edge_id_set_ids_local = (vector<int,_std::allocator<int>_> *)new_edges;
  new_edges_local =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)edges_to_discard;
  edges_to_discard_local = (vector<int,_std::allocator<int>_> *)g;
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(edges_to_discard);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)new_edges_local);
  bVar3 = std::
          is_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (local_30,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               )local_38);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
               ,0x76,kFatal,(ostream *)&std::cerr);
    poVar7 = S2LogMessage::stream(&local_50);
    poVar7 = std::operator<<(poVar7,
                             "Check failed: std::is_sorted(edges_to_discard.begin(), edges_to_discard.end()) "
                            );
    S2LogMessageVoidify::operator&(&local_39,poVar7);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             new_input_edge_id_set_ids_local);
  std::vector<int,_std::allocator<int>_>::clear(local_28);
  pvVar2 = new_input_edge_id_set_ids_local;
  EVar5 = S2Builder::Graph::num_edges((Graph *)edges_to_discard_local);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)pvVar2,
             (long)EVar5);
  pvVar2 = local_28;
  EVar5 = S2Builder::Graph::num_edges((Graph *)edges_to_discard_local);
  std::vector<int,_std::allocator<int>_>::reserve(pvVar2,(long)EVar5);
  cStack_70 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)new_edges_local);
  for (local_74 = 0; iVar1 = local_74,
      EVar5 = S2Builder::Graph::num_edges((Graph *)edges_to_discard_local), iVar1 < EVar5;
      local_74 = local_74 + 1) {
    local_80._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)new_edges_local);
    bVar4 = __gnu_cxx::operator!=(&stack0xffffffffffffff90,&local_80);
    iVar1 = local_74;
    bVar3 = false;
    if (bVar4) {
      piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&stack0xffffffffffffff90);
      bVar3 = iVar1 == *piVar6;
    }
    pvVar2 = new_input_edge_id_set_ids_local;
    if (bVar3) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&stack0xffffffffffffff90);
    }
    else {
      __x = S2Builder::Graph::edge((Graph *)edges_to_discard_local,local_74);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)pvVar2,__x);
      pvVar2 = local_28;
      local_84 = S2Builder::Graph::input_edge_id_set_id((Graph *)edges_to_discard_local,local_74);
      std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&local_84);
    }
  }
  local_90._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)new_edges_local);
  bVar3 = __gnu_cxx::operator==(&stack0xffffffffffffff90,&local_90);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
               ,0x84,kFatal,(ostream *)&std::cerr);
    poVar7 = S2LogMessage::stream(&local_a8);
    poVar7 = std::operator<<(poVar7,"Check failed: it == edges_to_discard.end() ");
    S2LogMessageVoidify::operator&(&local_91,poVar7);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a8);
  }
  return;
}

Assistant:

static void DiscardEdges(const Graph& g, const vector<EdgeId>& edges_to_discard,
                         vector<Edge>* new_edges,
                         vector<InputEdgeIdSetId>* new_input_edge_id_set_ids) {
  S2_DCHECK(std::is_sorted(edges_to_discard.begin(), edges_to_discard.end()));
  new_edges->clear();
  new_input_edge_id_set_ids->clear();
  new_edges->reserve(g.num_edges());
  new_input_edge_id_set_ids->reserve(g.num_edges());
  auto it = edges_to_discard.begin();
  for (int e = 0; e < g.num_edges(); ++e) {
    if (it != edges_to_discard.end() && e == *it) {
      ++it;
    } else {
      new_edges->push_back(g.edge(e));
      new_input_edge_id_set_ids->push_back(g.input_edge_id_set_id(e));
    }
  }
  S2_DCHECK(it == edges_to_discard.end());
}